

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleSignal.h
# Opt level: O0

void __thiscall
Simple::Lib::ProtoSignal<bool_(),_Simple::CollectorWhile0<bool>_>::ensure_ring
          (ProtoSignal<bool_(),_Simple::CollectorWhile0<bool>_> *this)

{
  SignalLink *this_00;
  function<bool_()> local_30;
  ProtoSignal<bool_(),_Simple::CollectorWhile0<bool>_> *local_10;
  ProtoSignal<bool_(),_Simple::CollectorWhile0<bool>_> *this_local;
  
  if (this->callback_ring_ == (SignalLink *)0x0) {
    local_10 = this;
    this_00 = (SignalLink *)operator_new(0x38);
    std::function<bool_()>::function(&local_30);
    SignalLink::SignalLink(this_00,&local_30);
    this->callback_ring_ = this_00;
    std::function<bool_()>::~function(&local_30);
    SignalLink::incref(this->callback_ring_);
    this->callback_ring_->next = this->callback_ring_;
    this->callback_ring_->prev = this->callback_ring_;
  }
  return;
}

Assistant:

void
  ensure_ring ()
  {
    if (!callback_ring_)
      {
        callback_ring_ = new SignalLink (CbFunction()); // ref_count = 1
        callback_ring_->incref(); // ref_count=2, head of ring, can be deactivated but not removed
        callback_ring_->next = callback_ring_; // ring head initialization
        callback_ring_->prev = callback_ring_; // ring tail initialization
      }
  }